

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O2

CaseResult * rc::detail::toCaseResult(CaseResult *__return_storage_ptr__,bool value)

{
  undefined7 in_register_00000031;
  string *this;
  allocator local_49;
  string local_48;
  string local_28;
  
  if ((int)CONCAT71(in_register_00000031,value) == 0) {
    std::__cxx11::string::string((string *)&local_48,"Returned false",&local_49);
    CaseResult::CaseResult(__return_storage_ptr__,Failure,&local_48);
    this = &local_48;
  }
  else {
    std::__cxx11::string::string((string *)&local_28,"Returned true",&local_49);
    CaseResult::CaseResult(__return_storage_ptr__,Success,&local_28);
    this = &local_28;
  }
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

CaseResult toCaseResult(bool value) {
  return value ? CaseResult(CaseResult::Type::Success, "Returned true")
               : CaseResult(CaseResult::Type::Failure, "Returned false");
}